

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O3

void copyFile(string *filepath,string *dirpath)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  undefined1 *puVar9;
  string filename;
  string filecontent;
  string names1 [100];
  string names2 [100];
  undefined1 *local_1a98;
  long local_1a90;
  undefined1 local_1a88 [16];
  undefined1 *local_1a78;
  long local_1a70;
  undefined1 local_1a68 [16];
  char *local_1a58;
  long local_1a50;
  char local_1a48 [16];
  string local_1a38;
  char *local_1a18;
  long local_1a10;
  char local_1a08 [16];
  char *local_19f8;
  long local_19f0;
  char local_19e8 [16];
  string local_19d8;
  char *local_19b8;
  long local_19b0;
  char local_19a8 [16];
  char *local_1998;
  long local_1990;
  char local_1988 [16];
  string local_1978;
  string local_1958;
  string local_1938 [99];
  undefined8 auStack_cd8 [2];
  char local_cc8 [8];
  char acStack_cc0 [8];
  string local_cb8 [99];
  undefined8 auStack_58 [2];
  char local_48 [24];
  
  lVar7 = 0x10;
  do {
    puVar9 = (undefined1 *)((long)&local_1938[0]._M_dataplus._M_p + lVar7);
    *(undefined1 **)((long)local_1938 + lVar7 + -0x10) = puVar9;
    *(undefined8 *)((long)local_1938 + lVar7 + -8) = 0;
    *puVar9 = 0;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0xc90);
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_1978._M_dataplus._M_p = (pointer)&local_1978.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1978,pcVar1,pcVar1 + filepath->_M_string_length);
  iVar3 = parsePath(&local_1978,local_1938);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1978._M_dataplus._M_p != &local_1978.field_2) {
    operator_delete(local_1978._M_dataplus._M_p);
  }
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_1998 = local_1988;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1998,pcVar1,pcVar1 + filepath->_M_string_length);
  iVar4 = doesExist(local_1938,iVar3,local_1990 == 0 || *local_1998 != '/');
  if (local_1998 != local_1988) {
    operator_delete(local_1998);
  }
  if (iVar3 == iVar4) {
    pcVar1 = (filepath->_M_dataplus)._M_p;
    local_19b8 = local_19a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_19b8,pcVar1,pcVar1 + filepath->_M_string_length);
    iVar4 = getId(local_1938,iVar3,local_19b0 == 0 || *local_19b8 != '/');
    if (local_19b8 != local_19a8) {
      operator_delete(local_19b8);
    }
    if (inodes[iVar4].i_mode == 1) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(filepath->_M_dataplus)._M_p,
                          filepath->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," is not a file.",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    else {
      lVar7 = 0x10;
      do {
        puVar9 = (undefined1 *)((long)&local_cb8[0]._M_dataplus._M_p + lVar7);
        *(undefined1 **)(local_cc8 + lVar7) = puVar9;
        pcVar2 = local_cc8 + lVar7 + 8;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        *puVar9 = 0;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0xc90);
      pcVar1 = (dirpath->_M_dataplus)._M_p;
      local_19d8._M_dataplus._M_p = (pointer)&local_19d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_19d8,pcVar1,pcVar1 + dirpath->_M_string_length);
      iVar5 = parsePath(&local_19d8,local_cb8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_19d8._M_dataplus._M_p != &local_19d8.field_2) {
        operator_delete(local_19d8._M_dataplus._M_p);
      }
      local_1a58 = local_1a48;
      pcVar1 = (dirpath->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a58,pcVar1,pcVar1 + dirpath->_M_string_length);
      iVar6 = doesExist(local_cb8,iVar5,local_1a50 == 0 || *local_1a58 != '/');
      if (local_1a58 != local_1a48) {
        operator_delete(local_1a58);
      }
      if (iVar5 == iVar6) {
        pcVar1 = (dirpath->_M_dataplus)._M_p;
        local_19f8 = local_19e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_19f8,pcVar1,pcVar1 + dirpath->_M_string_length);
        iVar5 = getId(local_cb8,iVar5,local_19f0 == 0 || *local_19f8 != '/');
        if (local_19f8 != local_19e8) {
          operator_delete(local_19f8);
        }
        pcVar1 = (filepath->_M_dataplus)._M_p;
        local_1a18 = local_1a08;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a18,pcVar1,pcVar1 + filepath->_M_string_length);
        iVar6 = getId(local_1938,iVar3 + -1,local_1a10 == 0 || *local_1a18 != '/');
        if (local_1a18 != local_1a08) {
          operator_delete(local_1a18);
        }
        if (inodes[iVar5].i_mode == 2) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(dirpath->_M_dataplus)._M_p,
                              dirpath->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," is not a folder.\n",0x12);
        }
        else if (iVar5 == iVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Invalid path.",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
        }
        else {
          local_1a98 = local_1a88;
          local_1a90 = 0;
          local_1a88[0] = 0;
          local_1a70 = 0;
          local_1a68[0] = 0;
          iVar4 = inodes[iVar4].i_blocks[0];
          iVar6 = inodes[iVar6].i_blocks[0];
          local_1a78 = local_1a68;
          strlen(emptyspaces + (long)iVar4 * 0x1000);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1a78,0,(char *)0x0,(ulong)(emptyspaces + (long)iVar4 * 0x1000));
          pcVar2 = local_1938[iVar3 + -1]._M_dataplus._M_p;
          lVar7 = 0x200;
          do {
            iVar3 = strcmp(emptyspaces + lVar7 + (long)iVar6 * 0x1000,pcVar2);
            if (iVar3 == 0) {
              std::__cxx11::string::operator=
                        ((string *)&local_1a98,emptyspaces + lVar7 + (long)iVar6 * 0x1000);
              break;
            }
            lVar7 = lVar7 + 0x100;
          } while (lVar7 != 0x1000);
          local_1a38._M_dataplus._M_p = (pointer)&local_1a38.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a38,local_1a98,local_1a98 + local_1a90);
          local_1958._M_dataplus._M_p = (pointer)&local_1958.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1958,local_1a78,local_1a78 + local_1a70);
          iVar3 = makeFileById(iVar5,&local_1a38,&local_1958);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1958._M_dataplus._M_p != &local_1958.field_2) {
            operator_delete(local_1958._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a38._M_dataplus._M_p != &local_1a38.field_2) {
            operator_delete(local_1a38._M_dataplus._M_p);
          }
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"current folder is full!",0x17);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          if (local_1a78 != local_1a68) {
            operator_delete(local_1a78);
          }
          if (local_1a98 != local_1a88) {
            operator_delete(local_1a98);
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid path.",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
      }
      lVar7 = 0;
      do {
        if (local_48 + lVar7 != *(char **)((long)auStack_58 + lVar7)) {
          operator_delete(*(char **)((long)auStack_58 + lVar7));
        }
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0xc80);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Invalid path.",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  lVar7 = 0;
  do {
    if (local_cc8 + lVar7 != *(char **)((long)auStack_cd8 + lVar7)) {
      operator_delete(*(char **)((long)auStack_cd8 + lVar7));
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0xc80);
  return;
}

Assistant:

void copyFile(string filepath, string dirpath) {
    string names1[100];
    int layers1 = parsePath(filepath, names1);
    int legal_layers1 = doesExist(names1, layers1, getPathType(filepath) == RELATIVE_PATH);
    if (layers1 == legal_layers1) {
        int id1 = getId(names1, layers1, getPathType(filepath) == RELATIVE_PATH);
        if (inodes[id1].i_mode == A_FOLDER) {
            setColor(COLOR_ERR);
            cout << filepath << " is not a file." << endl;
            setColor(COLOR_ORIGIN);
        }
        else {
            string names2[100];
            int layers2 = parsePath(dirpath, names2);
            int legal_layers2 = doesExist(names2, layers2, getPathType(dirpath) == RELATIVE_PATH);
            if (layers2 == legal_layers2) {//dirpath合法
                int id2 = getId(names2, layers2, getPathType(dirpath) == RELATIVE_PATH);
                int id3 = getId(names1, layers1 - 1, getPathType(filepath) == RELATIVE_PATH);
                if (inodes[id2].i_mode == A_FILE) {
                    setColor(COLOR_ERR);
                    cout << dirpath << " is not a folder.\n";
                    setColor(COLOR_ORIGIN);
                }
                else if (id2 == id3) {//若是需拷贝文件所在的目录
                    setColor(COLOR_ERR);
                    cout << "Invalid path." << endl;
                    setColor(COLOR_ORIGIN);
                }
                else {//完全合法
                    string filename, filecontent;
                    File_Block *p = getAddressByLocation_File(inodes[id1].i_blocks[0]);
                    dir_block *q = getAddressByLocation_Folder(inodes[id3].i_blocks[0]);
                    filecontent = p->data;
                    for (int i = 2; i < 16; i++) {
                        if (strcmp(q->dirs[i].name, names1[layers1 - 1].c_str()) == 0) {
                            filename = q->dirs[i].name;
                            break;
                        }
                    }
                    if(makeFileById(id2, filename, filecontent) == 0){
                        cout << "current folder is full!" << endl;
                        return;
                    }
                }
            }
            else {
                setColor(COLOR_ERR);
                cout << "Invalid path." << endl;
                setColor(COLOR_ORIGIN);
            }
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Invalid path." << endl;

    }
}